

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall Warning::Warning(Warning *this)

{
  this->backup = *(streambuf **)(*(long *)(std::cerr + -0x18) + 0x11f4e8);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->buf);
  std::ios::rdbuf((streambuf *)((long)&std::cerr + *(long *)(std::cerr + -0x18)));
  return;
}

Assistant:

Warning() : backup(std::cerr.rdbuf()), buf{} { std::cerr.rdbuf(buf.rdbuf()); }